

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<float>_>::PrepareZ
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *y,TPZFMatrix<Fad<float>_> *z,
          Fad<float> *beta,int opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fad<float> *pFVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  Vector<float> *this_00;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  long local_78;
  Fad<float> local_50;
  
  lVar5 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar5,lVar6);
  if (0 < lVar6) {
    local_78 = 0;
    lVar15 = 0;
    do {
      lVar7 = (z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
      if ((lVar7 < 1) || ((z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol <= lVar15)) {
        TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar8 = z->fElem;
      local_50.val_ = 0.0;
      local_50.dx_.num_elts = 0;
      local_50.dx_.ptr_to_data = (float *)0x0;
      local_50.defaultVal = 0.0;
      fVar1 = beta->val_;
      Fad<float>::~Fad(&local_50);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        if (z != y) {
          memcpy(pFVar8 + lVar7 * lVar15,
                 y->fElem + (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow * lVar15,
                 lVar5 << 5);
        }
        if (0 < lVar5) {
          lVar7 = (z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
          lVar13 = 0;
          do {
            if ((lVar7 <= lVar13) ||
               ((z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = lVar7 * lVar15;
            pFVar8 = z->fElem + lVar10 + lVar13;
            uVar3 = (beta->dx_).num_elts;
            uVar12 = (ulong)uVar3;
            uVar4 = z->fElem[lVar10 + lVar13].dx_.num_elts;
            uVar14 = (ulong)uVar4;
            fVar1 = beta->val_;
            if (uVar12 == 0) {
              if ((uVar14 != 0) && (0 < (int)uVar4)) {
                pfVar9 = (pFVar8->dx_).ptr_to_data;
                uVar12 = 0;
                do {
                  pfVar9[uVar12] = pfVar9[uVar12] * fVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
            }
            else {
              pfVar9 = (beta->dx_).ptr_to_data;
              if (uVar14 == 0) {
                (pFVar8->dx_).num_elts = uVar3;
                uVar14 = uVar12 * 4;
                if ((int)uVar3 < 0) {
                  uVar14 = 0xffffffffffffffff;
                }
                pfVar11 = (float *)operator_new__(uVar14);
                (pFVar8->dx_).ptr_to_data = pfVar11;
                if (0 < (int)uVar3) {
                  fVar2 = pFVar8->val_;
                  uVar14 = 0;
                  do {
                    pfVar11[uVar14] = pfVar9[uVar14] * fVar2;
                    uVar14 = uVar14 + 1;
                  } while (uVar12 != uVar14);
                }
              }
              else if (0 < (int)uVar4) {
                pfVar11 = (pFVar8->dx_).ptr_to_data;
                uVar12 = 0;
                do {
                  pfVar11[uVar12] = pFVar8->val_ * pfVar9[uVar12] + pfVar11[uVar12] * fVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
            }
            pFVar8->val_ = fVar1 * pFVar8->val_;
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar5);
        }
      }
      else if (lVar5 != 0) {
        this_00 = (Vector<float> *)((long)&(pFVar8->dx_).num_elts + lVar7 * local_78);
        sVar16 = lVar5 << 5;
        do {
          *(undefined4 *)&this_00[-1].ptr_to_data = 0;
          if (this_00->num_elts != 0) {
            local_50.val_ = 0.0;
            Vector<float>::operator=(this_00,&local_50.val_);
          }
          this_00 = this_00 + 2;
          sVar16 = sVar16 - 0x20;
        } while (sVar16 != 0);
      }
      lVar15 = lVar15 + 1;
      local_78 = local_78 + 0x20;
    } while (lVar15 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}